

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O0

void __thiscall xercesc_4_0::AbstractDOMParser::startDocument(AbstractDOMParser *this)

{
  DOMDocumentImpl *pDVar1;
  int iVar2;
  DOMImplementation *pDVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Locator *pLVar4;
  undefined4 extraout_var_01;
  ReaderMgr *this_00;
  XMLCh *actualEncoding;
  DOMNode *local_50;
  DOMNode *local_40;
  DOMDocumentImpl *local_38;
  DOMDocumentImpl *local_28;
  AbstractDOMParser *this_local;
  
  if (this->fImplementationFeatures == (XMLCh *)0x0) {
    pDVar3 = DOMImplementation::getImplementation();
    iVar2 = (*(pDVar3->super_DOMImplementationLS)._vptr_DOMImplementationLS[10])();
    if (CONCAT44(extraout_var,iVar2) == 0) {
      local_28 = (DOMDocumentImpl *)0x0;
    }
    else {
      local_28 = (DOMDocumentImpl *)(CONCAT44(extraout_var,iVar2) + -8);
    }
    this->fDocument = local_28;
  }
  else {
    pDVar3 = DOMImplementationRegistry::getDOMImplementation(this->fImplementationFeatures);
    iVar2 = (*(pDVar3->super_DOMImplementationLS)._vptr_DOMImplementationLS[10])();
    if (CONCAT44(extraout_var_00,iVar2) == 0) {
      local_38 = (DOMDocumentImpl *)0x0;
    }
    else {
      local_38 = (DOMDocumentImpl *)(CONCAT44(extraout_var_00,iVar2) + -8);
    }
    this->fDocument = local_38;
  }
  local_40 = (DOMNode *)0x0;
  if (this->fDocument != (DOMDocumentImpl *)0x0) {
    local_40 = &(this->fDocument->super_DOMDocument).super_DOMNode;
  }
  this->fCurrentParent = local_40;
  local_50 = (DOMNode *)0x0;
  if (this->fDocument != (DOMDocumentImpl *)0x0) {
    local_50 = &(this->fDocument->super_DOMDocument).super_DOMNode;
  }
  this->fCurrentNode = local_50;
  DOMDocumentImpl::setErrorChecking(this->fDocument,false);
  pDVar1 = this->fDocument;
  pLVar4 = XMLScanner::getLocator(this->fScanner);
  iVar2 = (*pLVar4->_vptr_Locator[3])();
  (*(pDVar1->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x5d])
            (pDVar1,CONCAT44(extraout_var_01,iVar2));
  pDVar1 = this->fDocument;
  this_00 = XMLScanner::getReaderMgr(this->fScanner);
  actualEncoding = ReaderMgr::getCurrentEncodingStr(this_00);
  DOMDocumentImpl::setInputEncoding(pDVar1,actualEncoding);
  return;
}

Assistant:

void AbstractDOMParser::startDocument()
{
    if(fImplementationFeatures == 0)
        fDocument = (DOMDocumentImpl *)DOMImplementation::getImplementation()->createDocument(fMemoryManager);
    else
        fDocument = (DOMDocumentImpl *)DOMImplementationRegistry::getDOMImplementation(fImplementationFeatures)->createDocument(fMemoryManager);

    // Just set the document as the current parent and current node
    fCurrentParent = fDocument;
    fCurrentNode   = fDocument;
    // set DOM error checking off
    fDocument->setErrorChecking(false);
    fDocument->setDocumentURI(fScanner->getLocator()->getSystemId());
    fDocument->setInputEncoding(fScanner->getReaderMgr()->getCurrentEncodingStr());
}